

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

void PrintHeader(int globalstrategy,int maxl,int maxlrst,realtype fnormtol,realtype scsteptol,
                int linsolver)

{
  int linsolver_local;
  realtype scsteptol_local;
  realtype fnormtol_local;
  int maxlrst_local;
  int maxl_local;
  int globalstrategy_local;
  
  printf("\nPredator-prey test problem --  KINSol (serial version)\n\n");
  printf("Mesh dimensions = %d X %d\n",5);
  printf("Number of species = %d\n",6);
  printf("Total system size = %d\n\n",0x96);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n",(ulong)(uint)globalstrategy);
  switch(linsolver) {
  case 0:
    printf("Linear solver is SPGMR with maxl = %d, maxlrst = %d\n",(ulong)(uint)maxl,
           (ulong)(uint)maxlrst);
    break;
  case 1:
    printf("Linear solver is SPBCGS with maxl = %d\n",(ulong)(uint)maxl);
    break;
  case 2:
    printf("Linear solver is SPTFQMR with maxl = %d\n",(ulong)(uint)maxl);
    break;
  case 3:
    printf("Linear solver is SPFGMR with maxl = %d, maxlrst = %d\n",(ulong)(uint)maxl,
           (ulong)(uint)maxlrst);
  }
  printf("Preconditioning uses interaction-only block-diagonal matrix\n");
  printf("Positivity constraints imposed on all components \n");
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",fnormtol,scsteptol);
  printf("\nInitial profile of concentration\n");
  printf("At all mesh points:  %g %g %g   %g %g %g\n",0x3ff0000000000000,0x3ff0000000000000,
         0x3ff0000000000000,0,0);
  return;
}

Assistant:

static void PrintHeader(int globalstrategy, int maxl, int maxlrst, 
                        realtype fnormtol, realtype scsteptol,
			int linsolver)
{
  printf("\nPredator-prey test problem --  KINSol (serial version)\n\n");
  printf("Mesh dimensions = %d X %d\n", MX, MY);
  printf("Number of species = %d\n", NUM_SPECIES);
  printf("Total system size = %d\n\n", NEQ);
  printf("Flag globalstrategy = %d (0 = None, 1 = Linesearch)\n",
         globalstrategy);

  switch(linsolver) {

  case(USE_SPGMR):
    printf("Linear solver is SPGMR with maxl = %d, maxlrst = %d\n",
	   maxl, maxlrst);
    break;

  case(USE_SPBCGS):
    printf("Linear solver is SPBCGS with maxl = %d\n", maxl);
    break;

  case(USE_SPTFQMR):
    printf("Linear solver is SPTFQMR with maxl = %d\n", maxl);
    break;

  case(USE_SPFGMR):
    printf("Linear solver is SPFGMR with maxl = %d, maxlrst = %d\n",
	   maxl, maxlrst);
    break;

  }

  printf("Preconditioning uses interaction-only block-diagonal matrix\n");
  printf("Positivity constraints imposed on all components \n");
#if defined(SUNDIALS_EXTENDED_PRECISION) 
  printf("Tolerance parameters:  fnormtol = %Lg   scsteptol = %Lg\n",
         fnormtol, scsteptol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",
         fnormtol, scsteptol);
#else
  printf("Tolerance parameters:  fnormtol = %g   scsteptol = %g\n",
         fnormtol, scsteptol);
#endif

  printf("\nInitial profile of concentration\n");
#if defined(SUNDIALS_EXTENDED_PRECISION) 
  printf("At all mesh points:  %Lg %Lg %Lg   %Lg %Lg %Lg\n", 
         PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("At all mesh points:  %g %g %g   %g %g %g\n", 
         PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#else
  printf("At all mesh points:  %g %g %g   %g %g %g\n", 
         PREYIN, PREYIN, PREYIN,
         PREDIN, PREDIN, PREDIN);
#endif
}